

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

float * stbi__ldr_to_hdr(stbi_uc *data,int x,int y,int comp)

{
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  double dVar1;
  float *output;
  int n;
  int k;
  int i;
  int in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  uint uVar2;
  int in_stack_ffffffffffffffdc;
  int iVar3;
  int local_20;
  float *local_8;
  
  if (in_RDI == (void *)0x0) {
    local_8 = (float *)0x0;
  }
  else {
    local_8 = (float *)stbi__malloc_mad4(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                                         (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                                         (int)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    if (local_8 == (float *)0x0) {
      free(in_RDI);
      stbi__err("outofmem");
      local_8 = (float *)0x0;
    }
    else {
      uVar2 = in_ECX;
      if ((in_ECX & 1) == 0) {
        uVar2 = in_ECX - 1;
      }
      for (local_20 = 0; local_20 < in_ESI * in_EDX; local_20 = local_20 + 1) {
        for (iVar3 = 0; iVar3 < (int)uVar2; iVar3 = iVar3 + 1) {
          dVar1 = pow((double)((float)*(byte *)((long)in_RDI +
                                               (long)(int)(local_20 * in_ECX + iVar3)) / 255.0),
                      (double)stbi__l2h_gamma);
          local_8[(int)(local_20 * in_ECX + iVar3)] = (float)(dVar1 * (double)stbi__l2h_scale);
        }
      }
      if ((int)uVar2 < (int)in_ECX) {
        for (local_20 = 0; local_20 < in_ESI * in_EDX; local_20 = local_20 + 1) {
          local_8[(int)(local_20 * in_ECX + uVar2)] =
               (float)*(byte *)((long)in_RDI + (long)(int)(local_20 * in_ECX + uVar2)) / 255.0;
        }
      }
      free(in_RDI);
    }
  }
  return local_8;
}

Assistant:

static float   *stbi__ldr_to_hdr(stbi_uc *data, int x, int y, int comp)
{
   int i,k,n;
   float *output;
   if (!data) return NULL;
   output = (float *) stbi__malloc_mad4(x, y, comp, sizeof(float), 0);
   if (output == NULL) { STBI_FREE(data); return stbi__errpf("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         output[i*comp + k] = (float) (pow(data[i*comp+k]/255.0f, stbi__l2h_gamma) * stbi__l2h_scale);
      }
   }
   if (n < comp) {
      for (i=0; i < x*y; ++i) {
         output[i*comp + n] = data[i*comp + n]/255.0f;
      }
   }
   STBI_FREE(data);
   return output;
}